

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_util.c
# Opt level: O2

size_t bitset_extract_setbits_avx512
                 (uint64_t *words,size_t length,uint32_t *vout,size_t outcapacity,uint32_t base)

{
  undefined1 (*pauVar1) [64];
  int iVar2;
  ulong uVar3;
  undefined1 (*pauVar4) [64];
  uint32_t *out;
  ulong uVar5;
  uint64_t uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  
  pauVar1 = (undefined1 (*) [64])(vout + outcapacity);
  auVar8 = vmovdqa64_avx512f((undefined1  [64])vbmi2_table);
  uVar5 = 0;
  for (pauVar4 = (undefined1 (*) [64])vout; (uVar5 < length && (pauVar4 + 4 < pauVar1));
      pauVar4 = (undefined1 (*) [64])(*pauVar4 + POPCOUNT(uVar6) * 4)) {
    uVar6 = words[uVar5];
    auVar9 = vpcompressb_avx512_vbmi2(auVar8,uVar6);
    auVar10 = vpbroadcastd_avx512f();
    auVar11 = vpmovsxbd_avx512f(auVar9._0_16_);
    auVar12 = vpmovsxbd_avx512f(auVar9._16_16_);
    auVar7 = vextracti32x4_avx512f(auVar9,2);
    auVar13 = vpmovsxbd_avx512f(auVar7);
    auVar7 = vextracti32x4_avx512f(auVar9,3);
    auVar9 = vpmovsxbd_avx512f(auVar7);
    auVar11 = vpaddd_avx512f(auVar10,auVar11);
    auVar12 = vpaddd_avx512f(auVar10,auVar12);
    auVar13 = vpaddd_avx512f(auVar10,auVar13);
    auVar10 = vpaddd_avx512f(auVar10,auVar9);
    auVar9 = vmovdqu64_avx512f(auVar11);
    *pauVar4 = auVar9;
    auVar9 = vmovdqu64_avx512f(auVar12);
    pauVar4[1] = auVar9;
    auVar9 = vmovdqu64_avx512f(auVar13);
    pauVar4[2] = auVar9;
    auVar9 = vmovdqu64_avx512f(auVar10);
    pauVar4[3] = auVar9;
    uVar5 = uVar5 + 1;
    base = base + 0x40;
  }
  while ((uVar5 < length && (pauVar4 < pauVar1))) {
    uVar6 = words[uVar5];
    for (; (uVar6 != 0 && (pauVar4 < pauVar1)); pauVar4 = (undefined1 (*) [64])(*pauVar4 + 4)) {
      iVar2 = 0;
      for (uVar3 = uVar6; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x8000000000000000) {
        iVar2 = iVar2 + 1;
      }
      *(uint32_t *)*pauVar4 = iVar2 + base;
      uVar6 = uVar6 - 1 & uVar6;
    }
    base = base + 0x40;
    uVar5 = uVar5 + 1;
  }
  return (long)pauVar4 - (long)vout >> 2;
}

Assistant:

size_t bitset_extract_setbits_avx512(const uint64_t *words, size_t length,
                                     uint32_t *vout, size_t outcapacity,
                                     uint32_t base) {
    uint32_t *out = (uint32_t *)vout;
    uint32_t *initout = out;
    uint32_t *safeout = out + outcapacity;
    __m512i base_v = _mm512_set1_epi32(base);
    __m512i index_table = _mm512_loadu_si512(vbmi2_table);
    size_t i = 0;

    for (; (i < length) && ((out + 64) < safeout); i += 1) {
        uint64_t v = words[i];
        __m512i vec = _mm512_maskz_compress_epi8(v, index_table);

        uint8_t advance = (uint8_t)roaring_hamming(v);

        __m512i vbase =
            _mm512_add_epi32(base_v, _mm512_set1_epi32((int)(i * 64)));
        __m512i r1 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 0));
        __m512i r2 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 1));
        __m512i r3 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 2));
        __m512i r4 = _mm512_cvtepi8_epi32(_mm512_extracti32x4_epi32(vec, 3));

        r1 = _mm512_add_epi32(r1, vbase);
        r2 = _mm512_add_epi32(r2, vbase);
        r3 = _mm512_add_epi32(r3, vbase);
        r4 = _mm512_add_epi32(r4, vbase);
        _mm512_storeu_si512((__m512i *)out, r1);
        _mm512_storeu_si512((__m512i *)(out + 16), r2);
        _mm512_storeu_si512((__m512i *)(out + 32), r3);
        _mm512_storeu_si512((__m512i *)(out + 48), r4);

        out += advance;
    }

    base += i * 64;

    for (; (i < length) && (out < safeout); ++i) {
        uint64_t w = words[i];
        while ((w != 0) && (out < safeout)) {
            uint64_t t =
                w & (~w + 1);  // on x64, should compile to BLSI (careful: the
                               // Intel compiler seems to fail)
            int r =
                roaring_trailing_zeroes(w);  // on x64, should compile to TZCNT
            uint32_t val = r + base;
            memcpy(out, &val,
                   sizeof(uint32_t));  // should be compiled as a MOV on x64
            out++;
            w ^= t;
        }
        base += 64;
    }

    return out - initout;
}